

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClassPropertySymbol::serializeTo(ClassPropertySymbol *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  char *in_RDI;
  string_view sVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  int local_40;
  void *local_38;
  size_t local_30;
  int local_20;
  void *local_18;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_RDI);
  sVar1 = ast::toString(Public);
  local_30 = sVar1._M_len;
  ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  if (*(int *)(in_RDI + 0x15c) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffb0,in_RDI);
    sVar1 = ast::toString(None);
    ASTSerializer::write(in_RSI,local_40,local_38,sVar1._M_len);
  }
  return;
}

Assistant:

void ClassPropertySymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);
    serializer.write("visibility", toString(visibility));
    if (randMode != RandMode::None)
        serializer.write("randMode", toString(randMode));
}